

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

bool __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,string_view filepath,openmode flags
          )

{
  anon_class_32_3_5262d2cd_for_func func;
  char cVar1;
  bool *pbVar2;
  Lazy<async_simple::Try<bool>_> *lazy;
  undefined1 uVar3;
  Lazy<async_simple::Try<bool>_> coro_func;
  Try<bool> result;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  basic_executor_type<std::allocator<void>,_0UL> local_38;
  char *pcStack_30;
  
  cVar1 = std::__basic_file<char>::is_open();
  uVar3 = 1;
  if (cVar1 == '\0') {
    func._12_4_ = local_48._12_4_;
    func.flags = flags;
    func.this = this;
    func.filepath._M_len = filepath._M_len;
    func.filepath._M_str = filepath._M_str;
    local_48._M_allocated_capacity = (size_type)this;
    local_48._8_4_ = flags;
    local_38.target_ = filepath._M_len;
    pcStack_30 = filepath._M_str;
    post<coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool(std::basic_string_view<char,std::char_traits<char>>,std::_Ios_Openmode)::_lambda()_1_>
              (func,(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                     *)local_60);
    async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
              ((Try<bool> *)(local_60 + 8),(coro *)local_60,lazy);
    pbVar2 = async_simple::Try<bool>::value((Try<bool> *)(local_60 + 8));
    uVar3 = *pbVar2;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>::
    ~_Variant_storage((_Variant_storage<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>
                       *)(local_60 + 8));
    async_simple::coro::detail::LazyBase<async_simple::Try<bool>,_false>::~LazyBase
              ((LazyBase<async_simple::Try<bool>,_false> *)local_60);
  }
  return (bool)uVar3;
}

Assistant:

bool open_stream_file_in_pool(std::string_view filepath,
                                std::ios::ios_base::openmode flags) {
    if (frw_seq_file_.is_open()) {
      return true;
    }
    auto coro_func = coro_io::post(
        [this, flags, filepath]() mutable {
          frw_seq_file_.open(filepath.data(), flags);
          if (!frw_seq_file_.is_open()) {
            std::cout << "line " << __LINE__ << " coro_file open failed "
                      << filepath << "\n";
            std::cerr << "Error: " << strerror(errno);
            return false;
          }
          return true;
        },
        &executor_wrapper_);
    auto result = async_simple::coro::syncAwait(coro_func);
    return result.value();
  }